

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vgmplayer.cpp
# Opt level: O3

void __thiscall
VGMPlayer::RefreshMuting(VGMPlayer *this,CHIP_DEVICE *chipDev,PLR_MUTE_OPTS *muteOpts)

{
  DEV_DATA *pDVar1;
  DEVFUNC_OPTMASK p_Var2;
  bool bVar3;
  byte bVar4;
  long lVar5;
  DEV_INFO *devInf;
  
  bVar4 = 1;
  lVar5 = 0;
  do {
    pDVar1 = (chipDev->base).defInf.dataPtr;
    if ((pDVar1 != (DEV_DATA *)0x0) &&
       (p_Var2 = ((chipDev->base).defInf.devDef)->SetMuteMask, p_Var2 != (DEVFUNC_OPTMASK)0x0)) {
      (*p_Var2)(pDVar1,muteOpts->chnMute[lVar5]);
    }
    chipDev = (CHIP_DEVICE *)(chipDev->base).linkDev;
    lVar5 = 1;
    bVar3 = (bool)(chipDev != (CHIP_DEVICE *)0x0 & bVar4);
    bVar4 = 0;
  } while (bVar3);
  return;
}

Assistant:

void VGMPlayer::RefreshMuting(VGMPlayer::CHIP_DEVICE& chipDev, const PLR_MUTE_OPTS& muteOpts)
{
	VGM_BASEDEV* clDev;
	UINT8 linkCntr = 0;
	
	for (clDev = &chipDev.base; clDev != NULL && linkCntr < 2; clDev = clDev->linkDev, linkCntr ++)
	{
		DEV_INFO* devInf = &clDev->defInf;
		if (devInf->dataPtr != NULL && devInf->devDef->SetMuteMask != NULL)
			devInf->devDef->SetMuteMask(devInf->dataPtr, muteOpts.chnMute[linkCntr]);
	}
	
	return;
}